

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLCompiledProgram::addUniqueTexture
          (GLCompiledProgram *this,ShaderSpecTexture *newTexture)

{
  bool bVar1;
  __type _Var2;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  GLShaderTexture *t;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
  *__range2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
  *in_stack_ffffffffffffff08;
  value_type *__x;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>_>
  *in_stack_ffffffffffffff10;
  GLShaderTexture *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff54;
  bool in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff59;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  reference local_30;
  GLShaderTexture *local_28;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>_>
  local_20;
  undefined1 *local_18;
  
  local_18 = (undefined1 *)((long)&in_RDI[1].field_2 + 8);
  local_20._M_current =
       (GLShaderTexture *)
       std::
       vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
       ::begin(in_stack_ffffffffffffff08);
  local_28 = (GLShaderTexture *)
             std::
             vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
             ::end(in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff10,
                       (__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) {
      __x = (value_type *)((long)&in_RDI[1].field_2 + 8);
      this_00 = (GLShaderTexture *)&stack0xffffffffffffff30;
      std::__cxx11::string::string((string *)this_00,in_RSI);
      std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer>::shared_ptr
                ((shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer> *)this_00,__x
                );
      std::
      vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
      ::push_back((vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
                   *)this_00,__x);
      GLShaderTexture::~GLShaderTexture(this_00);
      return;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>_>
               ::operator*(&local_20);
    _Var2 = std::operator==(in_stack_ffffffffffffff30,in_RDI);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderTexture_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>_>
    ::operator++(&local_20);
  }
  if (local_30->dim == *(int *)(in_RSI + 0x20)) {
    return;
  }
  __lhs = &local_70;
  std::operator+((char *)CONCAT71(in_stack_ffffffffffffff59,in_stack_ffffffffffffff58),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::operator+(__lhs,(char *)in_stack_ffffffffffffff10);
  exception((string *)in_stack_ffffffffffffff70._M_pi);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void GLCompiledProgram::addUniqueTexture(ShaderSpecTexture newTexture) {
  for (GLShaderTexture& t : textures) {
    if (t.name == newTexture.name) {

      // if it occurs twice, confirm that the occurences match
      if (t.dim != newTexture.dim)
        exception("texture " + t.name + " appears twice in program with different dimensions");

      return;
    }
  }
  textures.push_back(GLShaderTexture{newTexture.name, newTexture.dim, 777, false, nullptr, nullptr, 777});
}